

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statistics.cpp
# Opt level: O0

load_stats_status_t *
Statistics::loadFromFileStatistics(load_stats_status_t *__return_storage_ptr__,string *filename)

{
  bool bVar1;
  total_game_stats_t local_290;
  bool local_261 [8];
  bool local_259;
  undefined1 local_258 [8];
  total_game_stats_t stats;
  long local_220;
  ifstream statistics;
  string *filename_local;
  
  std::ifstream::ifstream(&local_220,(string *)filename,_S_in);
  bVar1 = std::ios::operator_cast_to_bool((ios *)((long)&local_220 + *(long *)(local_220 + -0x18)));
  if (bVar1) {
    anon_unknown_2::generateStatsFromInputData
              ((total_game_stats_t *)local_258,(istream *)&local_220);
    local_259 = true;
    std::tuple<bool,_Statistics::total_game_stats_t>::
    tuple<bool,_Statistics::total_game_stats_t_&,_true>
              (__return_storage_ptr__,&local_259,(total_game_stats_t *)local_258);
  }
  else {
    local_261[0] = false;
    local_290.bestScore = 0;
    local_290.totalMoveCount = 0;
    local_290.gameCount = 0;
    local_290.totalDuration = 0.0;
    local_290.winCount = 0;
    std::tuple<bool,_Statistics::total_game_stats_t>::
    tuple<bool,_Statistics::total_game_stats_t,_true>(__return_storage_ptr__,local_261,&local_290);
  }
  local_261[1] = true;
  local_261[2] = false;
  local_261[3] = false;
  local_261[4] = false;
  std::ifstream::~ifstream(&local_220);
  return __return_storage_ptr__;
}

Assistant:

load_stats_status_t loadFromFileStatistics(std::string filename) {
  std::ifstream statistics(filename);
  if (statistics) {
    total_game_stats_t stats = generateStatsFromInputData(statistics);
    return load_stats_status_t{true, stats};
  }
  return load_stats_status_t{false, total_game_stats_t{}};
}